

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O2

string * __thiscall
adios2::VariableNT::StructFieldName_abi_cxx11_
          (string *__return_storage_ptr__,VariableNT *this,size_t index)

{
  VariableBase *pointer;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pointer = this->m_Variable;
  std::__cxx11::string::string
            ((string *)&local_40,"in call to VariableNT::StructFieldName",(allocator *)&local_100);
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(int *)(this->m_Variable + 0x28) != 0x10) {
    std::__cxx11::string::string((string *)&local_100,"bindings::CXX11",&local_101);
    std::__cxx11::string::string((string *)&local_60,"VariableNT",&local_102);
    std::__cxx11::string::string((string *)&local_80,"StructFieldName",&local_103);
    adios2::ToString_abi_cxx11_((DataType)&local_e0);
    std::operator+(&local_c0,"invalid data type ",&local_e0);
    std::operator+(&local_a0,&local_c0,", only Struct type supports this API");
    helper::Throw<std::runtime_error>(&local_100,&local_60,&local_80,&local_a0,-1);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_100);
  }
  adios2::core::StructDefinition::Name_abi_cxx11_((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string VariableNT::StructFieldName(const size_t index) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFieldName");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFieldName",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Name(index);
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Name(index);
}